

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void Eigen::internal::evaluateProductBlockingSizesHeuristic<double,double,1,long>
               (long *k,long *m,long *n,long num_threads)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *plVar3;
  ulong *puVar4;
  long in_RCX;
  ulong *in_RDX;
  long *in_RSI;
  long *in_RDI;
  long mc;
  long max_mc;
  long actual_lm;
  long problem_size;
  long nc;
  long remaining_l1;
  long lhs_bytes;
  long max_nc;
  long actual_l2;
  long old_k;
  long max_kc;
  long m_per_thread;
  long m_cache;
  long n_per_thread;
  long n_cache;
  long k_cache;
  ptrdiff_t l3;
  ptrdiff_t l2;
  ptrdiff_t l1;
  ptrdiff_t *in_stack_fffffffffffffdf8;
  ptrdiff_t *in_stack_fffffffffffffe00;
  ptrdiff_t *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  ulong local_1d8;
  long local_1b8;
  ulong local_198;
  long local_190;
  long local_188;
  long local_180;
  ulong local_178;
  long local_170;
  long local_168;
  ulong local_160;
  ulong local_158;
  long local_150;
  ulong local_148 [3];
  long local_130;
  ulong local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  ulong local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  ulong *local_a8;
  long *local_a0;
  long *local_98;
  long *local_90;
  ulong *local_88;
  long *local_80;
  long *local_78;
  ulong *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  ulong *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  ulong *local_28;
  long *local_20;
  long *local_18;
  ulong *local_10;
  long *local_8;
  
  local_b0 = in_RCX;
  local_a8 = in_RDX;
  local_a0 = in_RSI;
  local_98 = in_RDI;
  manage_caching_sizes
            ((Action)((ulong)in_stack_fffffffffffffe10 >> 0x20),in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_18 = local_98;
  if (local_b0 < 2) {
    local_8 = local_a0;
    local_10 = local_a8;
    plVar3 = std::max<long>(local_a0,(long *)local_a8);
    local_118 = *plVar3;
    local_20 = &local_118;
    plVar3 = std::max<long>(local_18,local_20);
    if (0x2f < *plVar3) {
      local_128 = (long)(local_b8 - 0x80) / 0x40 & 0xfffffffffffffff8;
      local_130 = 1;
      local_28 = &local_128;
      local_30 = &local_130;
      plVar3 = std::max<long>((long *)local_28,local_30);
      local_120 = *plVar3;
      local_148[2] = *local_98;
      if (local_120 < *local_98) {
        local_1b8 = local_120;
        if (*local_98 % local_120 != 0) {
          local_1b8 = local_120 +
                      (((local_120 + -1) - *local_98 % local_120) /
                      ((*local_98 / local_120 + 1) * 8)) * -8;
        }
        *local_98 = local_1b8;
      }
      local_148[1] = 0x180000;
      local_150 = *local_a0 * *local_98 * 8;
      local_158 = (local_b8 - 0x80) + *local_a0 * *local_98 * -8;
      if ((long)local_158 < *local_98 * 0x20) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_120 << 5;
        local_148[0] = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x480000)) / auVar1,0);
      }
      else {
        local_148[0] = local_158 / (ulong)(*local_98 << 3);
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *local_98 << 4;
      local_168 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x180000)) / auVar2,0);
      local_68 = &local_168;
      local_70 = local_148;
      puVar4 = (ulong *)std::min<long>(local_68,(long *)local_70);
      local_1d8 = *puVar4 & 0xfffffffffffffffc;
      if ((long)local_1d8 < (long)*local_a8) {
        if ((long)*local_a8 % (long)local_1d8 != 0) {
          local_1d8 = local_1d8 +
                      ((long)(local_1d8 - (long)*local_a8 % (long)local_1d8) /
                      (((long)*local_a8 / (long)local_1d8 + 1) * 4)) * -4;
        }
        *local_a8 = local_1d8;
      }
      else if (local_148[2] == *local_98) {
        local_170 = *local_98 * *local_a8 * 8;
        local_178 = 0x180000;
        local_180 = *local_a0;
        local_160 = local_1d8;
        if (local_170 < 0x401) {
          local_178 = local_b8;
        }
        else if ((local_c8 != 0) && (local_170 < 0x8001)) {
          local_178 = local_c0;
          local_188 = 0x240;
          local_78 = &local_188;
          local_80 = &local_180;
          plVar3 = std::min<long>(local_78,local_80);
          local_180 = *plVar3;
        }
        local_198 = local_178 / (ulong)(*local_98 * 0x18);
        local_88 = &local_198;
        local_90 = &local_180;
        plVar3 = std::min<long>((long *)local_88,local_90);
        local_190 = *plVar3;
        if (local_190 < 5) {
          if (local_190 == 0) {
            return;
          }
        }
        else {
          local_190 = local_190 - local_190 % 4;
        }
        if (*local_a0 % local_190 != 0) {
          local_190 = local_190 +
                      ((local_190 - *local_a0 % local_190) / ((*local_a0 / local_190 + 1) * 4)) * -4
          ;
        }
        *local_a0 = local_190;
      }
    }
  }
  else {
    local_d8 = (long)(local_b8 - 0x80) / 0x40;
    local_e0 = 0x140;
    local_38 = &local_d8;
    local_40 = &local_e0;
    plVar3 = std::min<long>(local_38,local_40);
    local_d0 = *plVar3;
    if (local_d0 < *local_98) {
      *local_98 = local_d0 - local_d0 % 8;
    }
    local_e8 = (local_c0 - local_b8) / (ulong)(*local_98 << 5);
    local_f0 = numext::div_ceil<long>((long *)local_a8,&local_b0);
    if (local_f0 < (long)local_e8) {
      local_f8 = (local_f0 + 3) - (local_f0 + 3) % 4;
      local_48 = local_a8;
      local_50 = &local_f8;
      puVar4 = (ulong *)std::min<long>((long *)local_a8,local_50);
      *local_a8 = *puVar4;
    }
    else {
      *local_a8 = local_e8 - (long)local_e8 % 4;
    }
    if ((long)local_c0 < local_c8) {
      local_100 = (local_c8 - local_c0) / (ulong)(*local_98 * 8 * local_b0);
      local_108 = numext::div_ceil<long>(local_a0,&local_b0);
      if (((long)local_100 < local_108) && (3 < (long)local_100)) {
        *local_a0 = local_100 - (long)local_100 % 4;
      }
      else {
        local_110 = (local_108 + 3) - (local_108 + 3) % 4;
        local_58 = local_a0;
        local_60 = &local_110;
        plVar3 = std::min<long>(local_a0,local_60);
        *local_a0 = *plVar3;
      }
    }
  }
  return;
}

Assistant:

void evaluateProductBlockingSizesHeuristic(Index& k, Index& m, Index& n, Index num_threads = 1)
{
  typedef gebp_traits<LhsScalar,RhsScalar> Traits;

  // Explanations:
  // Let's recall that the product algorithms form mc x kc vertical panels A' on the lhs and
  // kc x nc blocks B' on the rhs. B' has to fit into L2/L3 cache. Moreover, A' is processed
  // per mr x kc horizontal small panels where mr is the blocking size along the m dimension
  // at the register level. This small horizontal panel has to stay within L1 cache.
  std::ptrdiff_t l1, l2, l3;
  manage_caching_sizes(GetAction, &l1, &l2, &l3);

  if (num_threads > 1) {
    typedef typename Traits::ResScalar ResScalar;
    enum {
      kdiv = KcFactor * (Traits::mr * sizeof(LhsScalar) + Traits::nr * sizeof(RhsScalar)),
      ksub = Traits::mr * Traits::nr * sizeof(ResScalar),
      kr = 8,
      mr = Traits::mr,
      nr = Traits::nr
    };
    // Increasing k gives us more time to prefetch the content of the "C"
    // registers. However once the latency is hidden there is no point in
    // increasing the value of k, so we'll cap it at 320 (value determined
    // experimentally).
    const Index k_cache = (numext::mini<Index>)((l1-ksub)/kdiv, 320);
    if (k_cache < k) {
      k = k_cache - (k_cache % kr);
      eigen_internal_assert(k > 0);
    }

    const Index n_cache = (l2-l1) / (nr * sizeof(RhsScalar) * k);
    const Index n_per_thread = numext::div_ceil(n, num_threads);
    if (n_cache <= n_per_thread) {
      // Don't exceed the capacity of the l2 cache.
      eigen_internal_assert(n_cache >= static_cast<Index>(nr));
      n = n_cache - (n_cache % nr);
      eigen_internal_assert(n > 0);
    } else {
      n = (numext::mini<Index>)(n, (n_per_thread + nr - 1) - ((n_per_thread + nr - 1) % nr));
    }

    if (l3 > l2) {
      // l3 is shared between all cores, so we'll give each thread its own chunk of l3.
      const Index m_cache = (l3-l2) / (sizeof(LhsScalar) * k * num_threads);
      const Index m_per_thread = numext::div_ceil(m, num_threads);
      if(m_cache < m_per_thread && m_cache >= static_cast<Index>(mr)) {
        m = m_cache - (m_cache % mr);
        eigen_internal_assert(m > 0);
      } else {
        m = (numext::mini<Index>)(m, (m_per_thread + mr - 1) - ((m_per_thread + mr - 1) % mr));
      }
    }
  }
  else {
    // In unit tests we do not want to use extra large matrices,
    // so we reduce the cache size to check the blocking strategy is not flawed
#ifdef EIGEN_DEBUG_SMALL_PRODUCT_BLOCKS
    l1 = 9*1024;
    l2 = 32*1024;
    l3 = 512*1024;
#endif

    // Early return for small problems because the computation below are time consuming for small problems.
    // Perhaps it would make more sense to consider k*n*m??
    // Note that for very tiny problem, this function should be bypassed anyway
    // because we use the coefficient-based implementation for them.
    if((numext::maxi)(k,(numext::maxi)(m,n))<48)
      return;

    typedef typename Traits::ResScalar ResScalar;
    enum {
      k_peeling = 8,
      k_div = KcFactor * (Traits::mr * sizeof(LhsScalar) + Traits::nr * sizeof(RhsScalar)),
      k_sub = Traits::mr * Traits::nr * sizeof(ResScalar)
    };

    // ---- 1st level of blocking on L1, yields kc ----

    // Blocking on the third dimension (i.e., k) is chosen so that an horizontal panel
    // of size mr x kc of the lhs plus a vertical panel of kc x nr of the rhs both fits within L1 cache.
    // We also include a register-level block of the result (mx x nr).
    // (In an ideal world only the lhs panel would stay in L1)
    // Moreover, kc has to be a multiple of 8 to be compatible with loop peeling, leading to a maximum blocking size of:
    const Index max_kc = numext::maxi<Index>(((l1-k_sub)/k_div) & (~(k_peeling-1)),1);
    const Index old_k = k;
    if(k>max_kc)
    {
      // We are really blocking on the third dimension:
      // -> reduce blocking size to make sure the last block is as large as possible
      //    while keeping the same number of sweeps over the result.
      k = (k%max_kc)==0 ? max_kc
                        : max_kc - k_peeling * ((max_kc-1-(k%max_kc))/(k_peeling*(k/max_kc+1)));

      eigen_internal_assert(((old_k/k) == (old_k/max_kc)) && "the number of sweeps has to remain the same");
    }

    // ---- 2nd level of blocking on max(L2,L3), yields nc ----

    // TODO find a reliable way to get the actual amount of cache per core to use for 2nd level blocking, that is:
    //      actual_l2 = max(l2, l3/nb_core_sharing_l3)
    // The number below is quite conservative: it is better to underestimate the cache size rather than overestimating it)
    // For instance, it corresponds to 6MB of L3 shared among 4 cores.
    #ifdef EIGEN_DEBUG_SMALL_PRODUCT_BLOCKS
    const Index actual_l2 = l3;
    #else
    const Index actual_l2 = 1572864; // == 1.5 MB
    #endif

    // Here, nc is chosen such that a block of kc x nc of the rhs fit within half of L2.
    // The second half is implicitly reserved to access the result and lhs coefficients.
    // When k<max_kc, then nc can arbitrarily growth. In practice, it seems to be fruitful
    // to limit this growth: we bound nc to growth by a factor x1.5.
    // However, if the entire lhs block fit within L1, then we are not going to block on the rows at all,
    // and it becomes fruitful to keep the packed rhs blocks in L1 if there is enough remaining space.
    Index max_nc;
    const Index lhs_bytes = m * k * sizeof(LhsScalar);
    const Index remaining_l1 = l1- k_sub - lhs_bytes;
    if(remaining_l1 >= Index(Traits::nr*sizeof(RhsScalar))*k)
    {
      // L1 blocking
      max_nc = remaining_l1 / (k*sizeof(RhsScalar));
    }
    else
    {
      // L2 blocking
      max_nc = (3*actual_l2)/(2*2*max_kc*sizeof(RhsScalar));
    }
    // WARNING Below, we assume that Traits::nr is a power of two.
    Index nc = numext::mini<Index>(actual_l2/(2*k*sizeof(RhsScalar)), max_nc) & (~(Traits::nr-1));
    if(n>nc)
    {
      // We are really blocking over the columns:
      // -> reduce blocking size to make sure the last block is as large as possible
      //    while keeping the same number of sweeps over the packed lhs.
      //    Here we allow one more sweep if this gives us a perfect match, thus the commented "-1"
      n = (n%nc)==0 ? nc
                    : (nc - Traits::nr * ((nc/*-1*/-(n%nc))/(Traits::nr*(n/nc+1))));
    }
    else if(old_k==k)
    {
      // So far, no blocking at all, i.e., kc==k, and nc==n.
      // In this case, let's perform a blocking over the rows such that the packed lhs data is kept in cache L1/L2
      // TODO: part of this blocking strategy is now implemented within the kernel itself, so the L1-based heuristic here should be obsolete.
      Index problem_size = k*n*sizeof(LhsScalar);
      Index actual_lm = actual_l2;
      Index max_mc = m;
      if(problem_size<=1024)
      {
        // problem is small enough to keep in L1
        // Let's choose m such that lhs's block fit in 1/3 of L1
        actual_lm = l1;
      }
      else if(l3!=0 && problem_size<=32768)
      {
        // we have both L2 and L3, and problem is small enough to be kept in L2
        // Let's choose m such that lhs's block fit in 1/3 of L2
        actual_lm = l2;
        max_mc = (numext::mini<Index>)(576,max_mc);
      }
      Index mc = (numext::mini<Index>)(actual_lm/(3*k*sizeof(LhsScalar)), max_mc);
      if (mc > Traits::mr) mc -= mc % Traits::mr;
      else if (mc==0) return;
      m = (m%mc)==0 ? mc
                    : (mc - Traits::mr * ((mc/*-1*/-(m%mc))/(Traits::mr*(m/mc+1))));
    }
  }
}